

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  int local_ac;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_00178218;
  if (this->read_fd_ == -1) {
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&(this->matcher_).
                    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  );
    return;
  }
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28,"CHECK failed: File ","");
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_28,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/build_O1/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                     );
  local_88._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar2) {
    local_88.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_88._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_88,", line ");
  local_d0._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == paVar2) {
    local_d0.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_d0._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  local_ac = 0x19c;
  StreamableToString<int>(&local_a8,&local_ac);
  uVar3 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    uVar3 = local_d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar3 < local_a8._M_string_length + local_d0._M_string_length) {
    uVar3 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      uVar3 = local_a8.field_2._M_allocated_capacity;
    }
    if (local_a8._M_string_length + local_d0._M_string_length <= (ulong)uVar3) {
      pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_a8,0,0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      goto LAB_001516bd;
    }
  }
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_d0,local_a8._M_dataplus._M_p,local_a8._M_string_length);
LAB_001516bd:
  local_f0._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == paVar2) {
    local_f0.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_f0._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  paVar2->_M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f0,": ");
  local_68._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar2) {
    local_68.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_68._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_68,"read_fd_ == -1");
  local_48._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == paVar2) {
    local_48.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_48.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_48._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_48);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

~DeathTestImpl() override { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }